

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O1

void float_values(WavpackStream *wps,int32_t *values,int32_t num_values)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int32_t iVar5;
  
  iVar3 = (uint)wps->float_shift + ((uint)wps->float_max_exp - (uint)wps->float_norm_exp);
  iVar2 = -0x20;
  if (-0x20 < iVar3) {
    iVar2 = iVar3;
  }
  iVar1 = 0;
  if (iVar2 < 0x20) {
    iVar1 = iVar2;
  }
  if (num_values != 0) {
    lVar4 = 0;
    do {
      if (iVar3 < 1) {
        if (iVar3 < 0) {
          iVar5 = values[lVar4] >> (-(byte)iVar1 & 0x1f);
          goto LAB_001b0bfa;
        }
      }
      else {
        iVar5 = values[lVar4] << ((byte)iVar1 & 0x1f);
LAB_001b0bfa:
        values[lVar4] = iVar5;
      }
      iVar5 = 0x7fffff;
      if ((0x7fffff < values[lVar4]) || (iVar5 = -0x800000, values[lVar4] < -0x800000)) {
        values[lVar4] = iVar5;
      }
      lVar4 = lVar4 + 1;
    } while (num_values != (int)lVar4);
  }
  return;
}

Assistant:

void float_values (WavpackStream *wps, int32_t *values, int32_t num_values)
{
    int shift = wps->float_max_exp - wps->float_norm_exp + wps->float_shift;

    if (shift > 32)
        shift = 32;
    else if (shift < -32)
        shift = -32;

    while (num_values--) {
        if (shift > 0)
            *values <<= shift;
        else if (shift < 0)
            *values >>= -shift;

        if (*values > 8388607L)
            *values = 8388607L;
        else if (*values < -8388608L)
            *values = -8388608L;

        values++;
    }
}